

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O3

__pid_t __thiscall QWaitCondition::wait(QWaitCondition *this,void *__stat_loc)

{
  int *piVar1;
  void *copy;
  long lVar2;
  int code;
  __pid_t _Var3;
  void *in_RDX;
  
  if (__stat_loc == (void *)0x0) {
    _Var3 = 0;
  }
  else {
    code = pthread_mutex_lock((pthread_mutex_t *)this->d);
    if (code != 0) {
      qErrnoWarning(code,"%s: %s failure","QWaitCondition::wait()","mutex lock");
    }
    piVar1 = &this->d->waiters;
    *piVar1 = *piVar1 + 1;
    LOCK();
    copy = *__stat_loc;
    *(undefined8 *)__stat_loc = 0;
    UNLOCK();
    if (copy != (void *)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)__stat_loc,copy);
    }
    _Var3 = QWaitConditionPrivate::wait(this->d,in_RDX);
    if (*__stat_loc == 0) {
      LOCK();
      lVar2 = *__stat_loc;
      if (lVar2 == 0) {
        *(undefined8 *)__stat_loc = 1;
      }
      UNLOCK();
      if (lVar2 == 0) {
        return _Var3;
      }
    }
    QBasicMutex::lockInternal((QBasicMutex *)__stat_loc);
  }
  return _Var3;
}

Assistant:

bool QWaitCondition::wait(QMutex *mutex, QDeadlineTimer deadline)
{
    if (!mutex)
        return false;

    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wait()", "mutex lock");
    ++d->waiters;
    mutex->unlock();

    bool returnValue = d->wait(deadline);

    mutex->lock();

    return returnValue;
}